

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bompiprobe.c
# Opt level: O1

int measure_lincost(int pid,int nprocs,int repeat,int msg_size,int total_size,int min_niters,
                   int niters,int ncomms,conf_interval_method_t conf_interval_method,int *n_samples,
                   char *sample_file_name,double *alpha_msg,double *alpha_msg_min,
                   double *alpha_msg_max,double *alpha_rma,double *alpha_rma_min,
                   double *alpha_rma_max,double *beta_msg,double *beta_msg_min,double *beta_msg_max,
                   double *beta_rma,double *beta_rma_min,double *beta_rma_max,double *beta_memcpy,
                   double *beta_memcpy_min,double *beta_memcpy_max,double conf_level)

{
  int iVar1;
  int iVar2;
  MPI_Comm comm;
  undefined8 *puVar3;
  FILE *pFVar4;
  char *pcVar5;
  char *pcVar6;
  void *pvVar7;
  MPI_Request *ppoVar8;
  int *piVar9;
  undefined8 *__ptr;
  uint uVar10;
  undefined4 in_register_0000000c;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  undefined8 *puVar14;
  ulong uVar15;
  size_t __nmemb;
  uint uVar16;
  undefined4 *puVar17;
  uint *puVar18;
  int iVar19;
  double dVar20;
  long lVar21;
  long lVar22;
  undefined8 *puVar23;
  int iVar24;
  double *pdVar25;
  double T_max [6];
  double T_min [6];
  double T [6];
  int o [7];
  undefined8 in_stack_fffffffffffffe38;
  uint local_1a8;
  uint local_1a4;
  double local_1a0;
  undefined8 *local_198;
  double local_190;
  int local_184;
  void *local_180;
  ulong local_178;
  char *local_170;
  size_t local_168;
  char *local_160;
  undefined8 *local_158;
  double local_150;
  undefined8 local_148;
  void *local_140;
  ulong local_138;
  MPI_Request *local_130;
  int local_128;
  int local_124;
  double local_120;
  ulong local_118;
  size_t local_110;
  size_t local_108;
  size_t local_100;
  size_t local_f8;
  FILE *local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  int local_58;
  int aiStack_54 [9];
  
  local_148 = CONCAT44(in_register_0000000c,msg_size);
  local_1a0 = (double)CONCAT44(local_1a0._4_4_,nprocs);
  local_168 = 0;
  local_1a4 = 0;
  local_1a8 = 0;
  local_118 = (long)total_size / (long)msg_size & 0xffffffff;
  *n_samples = 0;
  local_124 = repeat;
  local_120 = conf_level;
  if (sample_file_name == (char *)0x0 || pid != 0) {
    local_1a4 = 0;
  }
  else {
    pFVar4 = fopen(sample_file_name,"w");
    if (pFVar4 != (FILE *)0x0) {
      fwrite("#ID\tSTAMP\tMETHOD\tTOPOLOGY\tMSG_SIZE\tH_REL\tTIME\n",0x2e,1,pFVar4);
      local_1a4 = 0;
      goto LAB_001087e2;
    }
    local_1a4 = 1;
  }
  pFVar4 = (FILE *)0x0;
LAB_001087e2:
  uVar15 = 1;
  MPI_Allreduce(&local_1a4,&local_1a8,1,&ompi_mpi_int,&ompi_mpi_op_max,&ompi_mpi_comm_world);
  if (local_1a8 == 0) {
    local_190 = (double)CONCAT44(local_190._4_4_,total_size * 2);
    dVar20 = (double)(long)(total_size * 2);
    local_184 = pid;
    local_128 = min_niters;
    local_f0 = pFVar4;
    pcVar5 = (char *)calloc((size_t)dVar20,1);
    local_150 = dVar20;
    pcVar6 = (char *)calloc((size_t)dVar20,1);
    local_100 = (size_t)niters;
    local_178 = (ulong)(uint)niters;
    pvVar7 = calloc(local_100,0x28);
    local_f8 = (size_t)((int)local_118 * 2);
    ppoVar8 = (MPI_Request *)calloc(local_f8,8);
    local_108 = (size_t)local_1a0._0_4_;
    local_140 = calloc(local_108,4);
    __nmemb = (size_t)ncomms;
    local_198 = (undefined8 *)calloc(__nmemb,8);
    local_158 = (undefined8 *)calloc(__nmemb,8);
    uVar15 = (ulong)(uint)ncomms;
    if (0 < ncomms && local_158 != (undefined8 *)0x0) {
      uVar12 = 0;
      do {
        local_158[uVar12] = &ompi_mpi_comm_null;
        uVar12 = uVar12 + 1;
      } while (uVar15 != uVar12);
    }
    if (0 < ncomms && local_198 != (undefined8 *)0x0) {
      uVar12 = 0;
      do {
        local_198[uVar12] = &ompi_mpi_win_null;
        uVar12 = uVar12 + 1;
      } while (uVar15 != uVar12);
    }
    local_1a4 = (uint)(((local_140 == (void *)0x0 || local_198 == (undefined8 *)0x0) ||
                       local_158 == (undefined8 *)0x0) ||
                      ((ppoVar8 == (MPI_Request *)0x0 || pvVar7 == (void *)0x0) ||
                      (pcVar6 == (char *)0x0 || pcVar5 == (char *)0x0)));
    local_130 = ppoVar8;
    local_110 = __nmemb;
    MPI_Allreduce(&local_1a4,&local_1a8,1,&ompi_mpi_int,&ompi_mpi_op_max,&ompi_mpi_comm_world);
    dVar20 = local_150;
    local_180 = pvVar7;
    local_170 = pcVar6;
    local_160 = pcVar5;
    if (local_1a8 == 0) {
      memset(pcVar5,1,(size_t)local_150);
      memset(pcVar6,2,(size_t)dVar20);
      pvVar7 = local_140;
      puVar3 = local_158;
      if (0 < local_1a0._0_4_) {
        uVar12 = 0;
        do {
          *(int *)((long)local_140 + uVar12 * 4) = (int)uVar12;
          uVar12 = uVar12 + 1;
        } while (((ulong)local_1a0 & 0xffffffff) != uVar12);
      }
      MPI_Comm_dup(&ompi_mpi_comm_world,local_158);
      MPI_Win_create(pcVar6,dVar20,1,&ompi_mpi_info_null,*puVar3,local_198);
      if (1 < ncomms) {
        local_190 = (double)(long)local_184;
        lVar21 = 8;
        do {
          permute(&local_168,pvVar7,local_1a0._0_4_,4);
          MPI_Comm_split(*puVar3,0,*(undefined4 *)((long)pvVar7 + (long)local_190 * 4),
                         (long)puVar3 + lVar21);
          MPI_Win_create(pcVar6,local_150,1,&ompi_mpi_info_null,
                         *(undefined8 *)((long)puVar3 + lVar21),(long)local_198 + lVar21);
          lVar21 = lVar21 + 8;
        } while (uVar15 * 8 - lVar21 != 0);
      }
      pvVar7 = local_180;
      uVar12 = (ulong)(uint)niters;
      if (0 < niters) {
        piVar9 = (int *)((long)local_180 + 0xc);
        uVar11 = 0;
        do {
          *piVar9 = (((uint)uVar11 & 1) + 1) * (int)local_148;
          uVar11 = uVar11 + 1;
          piVar9 = piVar9 + 10;
        } while (uVar12 != uVar11);
      }
      local_138 = uVar15;
      permute(&local_168,local_180,niters,0x28);
      pcVar5 = local_170;
      iVar13 = (int)local_118;
      if (0 < niters) {
        puVar17 = (undefined4 *)((long)pvVar7 + 8);
        uVar15 = 0;
        do {
          *puVar17 = (int)((long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff)
                          % (long)(iVar13 + 1));
          uVar15 = uVar15 + 1;
          puVar17 = puVar17 + 10;
        } while (uVar12 != uVar15);
      }
      permute(&local_168,pvVar7,niters,0x28);
      if (0 < niters) {
        puVar17 = (undefined4 *)((long)pvVar7 + 0x10);
        uVar15 = 0;
        do {
          *puVar17 = (int)((long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff)
                          % (long)ncomms);
          uVar15 = uVar15 + 1;
          puVar17 = puVar17 + 10;
        } while (uVar12 != uVar15);
      }
      permute(&local_168,pvVar7,niters,0x28);
      if (0 < niters) {
        lVar21 = 0;
        uVar16 = 0;
        do {
          *(uint *)((long)pvVar7 + lVar21 + 0x14) = uVar16 % 3;
          uVar16 = uVar16 + 1;
          lVar21 = lVar21 + 0x28;
        } while (uVar12 * 0x28 != lVar21);
      }
      permute(&local_168,pvVar7,niters,0x28);
      iVar19 = local_124;
      puVar3 = local_158;
      pcVar6 = local_160;
      if (0 < ncomms) {
        iVar24 = (int)local_148 * 2;
        local_1a0 = (double)CONCAT44(local_1a0._4_4_,iVar24);
        uVar15 = 0;
        do {
          in_stack_fffffffffffffe38 =
               CONCAT44((int)((ulong)in_stack_fffffffffffffe38 >> 0x20),iVar19);
          measure_hrel_msg((MPI_Comm)puVar3[uVar15],pcVar6,pcVar5,local_130,iVar13,iVar24,iVar19);
          measure_hrel_rma((MPI_Comm)puVar3[uVar15],(MPI_Win)local_198[uVar15],pcVar6,iVar13,iVar24,
                           iVar19);
          measure_hrel_memcpy((MPI_Comm)puVar3[uVar15],pcVar6,local_170,iVar13,iVar24,iVar19);
          uVar15 = uVar15 + 1;
          pcVar5 = local_170;
        } while (local_138 != uVar15);
      }
      local_190 = 10.0;
      dVar20 = bsp_time();
      uVar15 = local_138;
      if (0 < niters) {
        lVar22 = (long)local_128;
        pdVar25 = (double *)((long)local_180 + 0x20);
        iVar13 = -1;
        lVar21 = 0;
        local_1a0 = dVar20;
        local_150 = dVar20;
        do {
          iVar24 = *(int *)(pdVar25 + -3);
          iVar1 = *(int *)((long)pdVar25 + -0x14);
          comm = (MPI_Comm)local_158[*(int *)(pdVar25 + -2)];
          iVar2 = *(int *)((long)pdVar25 + -0xc);
          if (iVar2 == 2) {
            dVar20 = measure_hrel_memcpy(comm,local_160,local_170,iVar24,iVar1,iVar19);
          }
          else if (iVar2 == 1) {
            in_stack_fffffffffffffe38 =
                 CONCAT44((int)((ulong)in_stack_fffffffffffffe38 >> 0x20),iVar19);
            dVar20 = measure_hrel_msg(comm,local_160,local_170,local_130,iVar24,iVar1,iVar19);
          }
          else {
            dVar20 = INFINITY;
            if (iVar2 == 0) {
              dVar20 = measure_hrel_rma(comm,(MPI_Win)local_198[*(int *)(pdVar25 + -2)],local_160,
                                        iVar24,iVar1,iVar19);
            }
          }
          pdVar25[-4] = dVar20;
          dVar20 = bsp_time();
          *pdVar25 = dVar20 - local_1a0;
          uVar16 = (uint)lVar21;
          *(uint *)(pdVar25 + -1) = uVar16;
          if ((local_184 == 0) && (dVar20 = bsp_time(), 10.0 < dVar20 - local_150)) {
            dVar20 = bsp_time();
            printf("# Sample time remaining: %.0f seconds\n#    (Press CTRL+C to interrupt)\n",
                   ((dVar20 - local_1a0) / (double)(int)uVar16) * (double)((int)local_178 + iVar13))
            ;
            local_150 = bsp_time();
          }
          MPI_Allreduce(&s_interrupted,&local_1a8,1,&ompi_mpi_int,&ompi_mpi_op_max,
                        &ompi_mpi_comm_world);
          iVar24 = 8;
          if (lVar22 < lVar21) {
            iVar24 = 0x1e;
          }
          uVar10 = (uint)local_178;
          if (lVar22 < lVar21) {
            uVar10 = uVar16;
          }
          if (local_1a8 == 0) {
            iVar24 = 0;
          }
          local_178 = local_178 & 0xffffffff;
          if (local_1a8 != 0) {
            local_178 = (ulong)uVar10;
          }
          if (iVar24 != 0) {
            if (iVar24 == 8) goto LAB_0010931d;
            if (iVar24 != 0x1e) goto LAB_001093c0;
            break;
          }
          lVar21 = lVar21 + 1;
          pdVar25 = pdVar25 + 5;
          iVar13 = iVar13 + -1;
        } while (lVar21 < (int)local_178);
      }
      pFVar4 = local_f0;
      pvVar7 = local_180;
      local_190 = local_190 / (1.0 - local_120);
      if (local_f0 != (FILE *)0x0) {
        if (0 < (int)local_178) {
          uVar12 = local_178 & 0xffffffff;
          lVar21 = 0;
          do {
            in_stack_fffffffffffffe38 =
                 CONCAT44((int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                          *(undefined4 *)((long)pvVar7 + lVar21 + 8));
            fprintf(pFVar4,"%d\t%.15e\t%d\t%d\t%d\t%d\t%.15e\n",
                    *(undefined8 *)((long)pvVar7 + lVar21 + 0x20),
                    *(undefined8 *)((long)pvVar7 + lVar21),
                    (ulong)*(uint *)((long)pvVar7 + lVar21 + 0x18),
                    (ulong)*(uint *)((long)pvVar7 + lVar21 + 0x14),
                    (ulong)*(uint *)((long)pvVar7 + lVar21 + 0x10),
                    (ulong)*(uint *)((long)pvVar7 + lVar21 + 0xc),in_stack_fffffffffffffe38);
            lVar21 = lVar21 + 0x28;
          } while (uVar12 * 0x28 != lVar21);
        }
        fclose(pFVar4);
      }
      pvVar7 = local_180;
      iVar24 = (int)local_190;
      iVar19 = (int)local_178;
      qsort(local_180,(long)iVar19,0x28,cmp_lincost_sample);
      local_58 = 0;
      uVar12 = 0;
      iVar13 = 0;
      do {
        iVar1 = iVar13;
        if (iVar13 < iVar19) {
          puVar18 = (uint *)((long)pvVar7 + (long)iVar13 * 0x28 + 0x14);
          lVar21 = 0;
          do {
            if ((puVar18[-2] != (((uint)uVar12 & 1) + 1) * (int)local_148) ||
               (*puVar18 != ((uint)(uVar12 >> 1) & 0x7fffffff))) {
              iVar1 = iVar13 - (int)lVar21;
              break;
            }
            lVar21 = lVar21 + -1;
            puVar18 = puVar18 + 10;
            iVar1 = iVar19;
          } while ((long)iVar13 - (long)iVar19 != lVar21);
        }
        iVar13 = iVar1;
        aiStack_54[uVar12] = iVar13;
        uVar12 = uVar12 + 1;
      } while (uVar12 != 6);
      local_1a4 = (*conf_interval_method)
                            (&local_168,local_180,0x28,lincost_samples_get_hrel_time,&local_58,6,
                             local_120,iVar24,&local_88,&local_b8,&local_e8);
      MPI_Allreduce(&local_1a4,&local_1a8,1,&ompi_mpi_int,&ompi_mpi_op_max,&ompi_mpi_comm_world);
      if (local_1a8 == 0) {
        *alpha_rma = (local_88 + local_88) - local_80;
        *alpha_rma_min = (local_b8 + local_b8) - local_e0;
        *alpha_rma_max = (local_e8 + local_e8) - local_b0;
        *alpha_msg = (local_78 + local_78) - local_70;
        *alpha_msg_min = (local_a8 + local_a8) - local_d0;
        dVar20 = (double)(int)local_148;
        *alpha_msg_max = (local_d8 + local_d8) - local_a0;
        *beta_rma = (local_80 - local_88) / dVar20;
        *beta_rma_min = (local_b0 - local_e8) / dVar20;
        *beta_rma_max = (local_e0 - local_b8) / dVar20;
        *beta_msg = (local_70 - local_78) / dVar20;
        *beta_msg_min = (local_a0 - local_d8) / dVar20;
        *beta_msg_max = (local_d0 - local_a8) / dVar20;
        *beta_memcpy = (local_60 - local_68) / dVar20;
        *beta_memcpy_min = (local_90 - local_c8) / dVar20;
        *beta_memcpy_max = (local_c0 - local_98) / dVar20;
        *n_samples = iVar19;
      }
    }
    else if (local_184 == 0) {
      fprintf(_stderr,
              "Insufficient memory. For a benchmark on %d processes I require 2x %d bytes of memory for send and receive buffers, %ld bytes for storing the measurements, %ld bytes for the request queue, %ld bytes for communication infrastructure\n"
              ,local_108,(ulong)local_190 & 0xffffffff,local_100 * 0x28,local_f8 << 3,
              local_110 * 0x10 + local_108 * 4);
    }
LAB_0010931d:
    puVar3 = local_158;
    __ptr = local_198;
    puVar14 = local_198;
    puVar23 = local_158;
    if (0 < ncomms) {
      do {
        if ((undefined *)*puVar14 != &ompi_mpi_win_null) {
          MPI_Win_free(puVar14);
          __ptr = local_198;
        }
        if ((undefined *)*puVar23 != &ompi_mpi_comm_null) {
          MPI_Comm_free(puVar23);
          __ptr = local_198;
        }
        uVar15 = uVar15 - 1;
        puVar14 = puVar14 + 1;
        puVar23 = puVar23 + 1;
      } while (uVar15 != 0);
    }
    free(local_160);
    free(local_170);
    free(local_180);
    free(local_130);
    free(puVar3);
    free(local_140);
    free(__ptr);
    uVar15 = (ulong)local_1a8;
  }
  else if (pid == 0) {
    fprintf(_stderr,"Could not open file \'%s\' for writing sample data\n",sample_file_name);
  }
LAB_001093c0:
  return (int)uVar15;
}

Assistant:

int measure_lincost( int pid, int nprocs, int repeat,
        int msg_size, int total_size, int min_niters, int niters, int ncomms,
        conf_interval_method_t conf_interval_method,
        int * n_samples, 
        const char * sample_file_name,
        double * alpha_msg, double * alpha_msg_min, double * alpha_msg_max, 
        double * alpha_rma, double * alpha_rma_min, double * alpha_rma_max, 
        double * beta_msg, double * beta_msg_min, double * beta_msg_max,
        double * beta_rma, double * beta_rma_min, double * beta_rma_max,
        double * beta_memcpy, double *beta_memcpy_min, double *beta_memcpy_max,
        double conf_level )
{
    char * sendbuf, * recvbuf;
    lincost_sample_t * samples;
    size_t rng = 0;
    int i, k, my_error=0, glob_error=0;
    MPI_Request * reqs = 0; 
    int * pid_perms;
    MPI_Win * wins;  MPI_Comm * comms;
    const int n_avgs = (int) (10.0 / (1.0 - conf_level));
    const int max_h = total_size / msg_size;
    int o[7];  /* two methods x two msg sizes + 1 */
    double T[6], T_min[6], T_max[6]; /* two methods x two msg sizes */
    FILE * sample_file;
    double t0, t1;

    * n_samples = 0;

    if ( pid == 0 && sample_file_name ) {
        sample_file = fopen( sample_file_name, "w" );
        if (sample_file) {
            fprintf( sample_file, "#ID\tSTAMP\tMETHOD\tTOPOLOGY\t"
                                  "MSG_SIZE\tH_REL\tTIME\n" );
            my_error = 0;
        }
        else {
            my_error = 1;
        }
    }
    else {
        sample_file = NULL;
        my_error = 0;
    }

    MPI_Allreduce( &my_error, &glob_error, 1, MPI_INT, 
            MPI_MAX, MPI_COMM_WORLD );
    if ( glob_error ) {
        if (!pid) fprintf( stderr,
                "Could not open file '%s' for writing sample data\n",
                sample_file_name );
        return 1;
    }
 

    /* allocate memory */
    sendbuf = calloc( 2* total_size, 1 );
    recvbuf = calloc( 2* total_size, 1 );
    samples =  calloc( niters, sizeof(samples[0]) );
    reqs = calloc( 2*max_h, sizeof(MPI_Request) );
    pid_perms = calloc( nprocs, sizeof(pid_perms[0]) );
    wins = calloc( ncomms, sizeof(MPI_Win) );
    comms = calloc( ncomms, sizeof(MPI_Comm) ); 

    if (comms) {
        for ( i = 0; i < ncomms; ++i )
            comms[i] = MPI_COMM_NULL;
    }
    if (wins) { 
        for ( i = 0; i < ncomms; ++i) 
            wins[i] = MPI_WIN_NULL;
    }

    my_error = !sendbuf || !recvbuf || !samples || !reqs
            || !pid_perms || !wins || !comms;
    MPI_Allreduce( &my_error, &glob_error, 1, MPI_INT, 
            MPI_MAX, MPI_COMM_WORLD );
    if ( glob_error ) {
        if (!pid) fprintf( stderr,
                "Insufficient memory. For a benchmark on "
                "%d processes I require 2x %d bytes of memory "
                "for send and receive buffers, %ld bytes for "
                "storing the measurements, %ld bytes for "
                "the request queue, %ld bytes for "
                "communication infrastructure\n",
                nprocs,  2*total_size,
                (long) niters * (long) sizeof(samples[0]),
                2*max_h * (long) sizeof(MPI_Request),
               ncomms * (long) sizeof(MPI_Win) +
               ncomms * (long) sizeof(MPI_Comm) +
               nprocs * (long) sizeof(pid_perms[0]) );
        goto exit;
    }

    memset( sendbuf, 1, 2*total_size );
    memset( recvbuf, 2, 2*total_size );

    /* Create random topologies */
    for ( i = 0 ; i < nprocs; ++i )
        pid_perms[i] = i;

    MPI_Comm_dup( MPI_COMM_WORLD, &comms[0] );
    MPI_Win_create( recvbuf, 2*total_size, 1,
            MPI_INFO_NULL, comms[0], & wins[0] );

    for ( i = 1; i < ncomms; ++i ) {
        permute( &rng, pid_perms, nprocs, sizeof(pid_perms[0]) );

        MPI_Comm_split( comms[0], 0, pid_perms[pid], &comms[i] );
        MPI_Win_create( recvbuf, 2*total_size, 1,
            MPI_INFO_NULL, comms[i], & wins[i] );
    }

    /* Create measurement points */
    for ( i = 0 ; i < niters; ++i )
        samples[i].msg_size = (i%2 + 1) * msg_size;

    permute( &rng, samples, niters, sizeof(samples[0]) );

    for ( i = 0; i < niters; ++i ) 
        samples[i].h = i % ( max_h + 1);

    permute( &rng, samples, niters, sizeof(samples[0]) );

    for ( i = 0; i < niters; ++i )
       samples[i].comm = i % ncomms; 

    permute( &rng, samples, niters, sizeof(samples[0]) );

    for ( i = 0 ; i < niters; ++i )
        samples[i].method = i % 3;

    permute( &rng, samples, niters, sizeof(samples[0]) );


    /* Warm up */
    for ( i = 0; i < ncomms; ++i ) {
        measure_hrel_msg( comms[i], sendbuf, recvbuf, reqs, 
                max_h, 2*msg_size, repeat );
        measure_hrel_rma( comms[i], wins[i], sendbuf, 
                max_h, 2*msg_size, repeat );
        measure_hrel_memcpy( comms[i], sendbuf, recvbuf, 
                max_h, 2*msg_size, repeat );
    }

    /* And now the measurements */
    t0 = t1 = bsp_time();
    for ( i = 0; i < niters; ++i ) {
        double t = HUGE_VAL;
        int h    = samples[i].h;
        int size = samples[i].msg_size;
        MPI_Comm comm = comms[ samples[i].comm ];
        MPI_Win win = wins[ samples[i].comm ];

        switch( samples[i].method ) {
            case 0: t = measure_hrel_rma( comm, win, sendbuf, 
                                          h, size, repeat );
                    break;
            case 1: t = measure_hrel_msg( comm, sendbuf, recvbuf, reqs, 
                                          h, size, repeat );
                    break;
            case 2: t = measure_hrel_memcpy( comm, sendbuf, recvbuf,
                                          h, size, repeat );
                    break;
        }

        samples[i].time = t;
        samples[i].timestamp = bsp_time() - t0;
        samples[i].serial = i;

        if ( !pid && bsp_time() - t1 > 10.0 ) {
            printf("# Sample time remaining: %.0f seconds\n"
                   "#    (Press CTRL+C to interrupt)\n",
                    (bsp_time() - t0) / i *(niters - i - 1) );
            t1 = bsp_time();
        }

        MPI_Allreduce( &s_interrupted, &glob_error, 1, MPI_INT,
                MPI_MAX, MPI_COMM_WORLD );
        if ( glob_error ) { 
            if (i > min_niters) {
                niters = i;
                break;
            }
            else {
                goto exit;
            }
        }
    } 

    /* Saving data */
    if (sample_file) {
        for ( i = 0; i < niters; ++i ) {
            fprintf( sample_file, 
                      "%d\t%.15e\t%d\t%d\t%d\t%d\t%.15e\n",
                      samples[i].serial, samples[i].timestamp,
                      samples[i].method, samples[i].comm,
                      samples[i].msg_size, samples[i].h, samples[i].time );
        }
        fclose( sample_file );
        sample_file = NULL;
    }

    /* Analysis */

    /* sort on (msg_size, method) */
    qsort( samples, niters, sizeof(samples[0]), cmp_lincost_sample );
    
    /* create an index to each (msg_size, method) in array 'o' */
    o[0] = 0;
    i = 0;
    for ( k = 0; k < 6; ++k ) {
        for ( ; i < niters; ++i )
            if (samples[i].msg_size != (k%2+1)*msg_size
                || samples[i].method != (k/2) )
                break;

        o[k+1] = i;
    }
 
    my_error = (*conf_interval_method)( &rng, samples, sizeof(samples[0]), 
           lincost_samples_get_hrel_time, 
           o, 6, conf_level, n_avgs,
           T, T_min, T_max );
    MPI_Allreduce( &my_error, &glob_error, 1, MPI_INT, 
            MPI_MAX, MPI_COMM_WORLD );
    if (glob_error) {
        goto exit;
    }
   
    /* saving results */
    *alpha_rma     = 2*T[0] - T[1];
    *alpha_rma_min = 2*T_min[0] - T_max[1];
    *alpha_rma_max = 2*T_max[0] - T_min[1];

    *alpha_msg     = 2*T[2] - T[3];
    *alpha_msg_min = 2*T_min[2] - T_max[3];
    *alpha_msg_max = 2*T_max[2] - T_min[3];

    *beta_rma = (T[1] - T[0])/msg_size ;
    *beta_rma_min = (T_min[1] - T_max[0])/msg_size;
    *beta_rma_max = (T_max[1] - T_min[0])/msg_size;

    *beta_msg = (T[3] - T[2])/msg_size ;
    *beta_msg_min = (T_min[3] - T_max[2])/msg_size;
    *beta_msg_max = (T_max[3] - T_min[2])/msg_size;

    *beta_memcpy = (T[5] - T[4])/msg_size ;
    *beta_memcpy_min = (T_min[5] - T_max[4])/msg_size;
    *beta_memcpy_max = (T_max[5] - T_min[4])/msg_size;

    *n_samples = niters;

exit:
    /* free resources */
    for ( i = 0; i < ncomms; ++i ) {
        if (wins[i] != MPI_WIN_NULL)
            MPI_Win_free( &wins[i] );

        if (comms[i] != MPI_COMM_NULL )
            MPI_Comm_free( &comms[i] );
    }

    free( sendbuf );
    free( recvbuf );
    free( samples );
    free( reqs );
    free( comms );
    free( pid_perms );
    free( wins );
    
    return glob_error;
}